

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testValidCustom(void)

{
  RepeatedField<long> *this;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  TypeUnion this_00;
  Type *this_01;
  LayerUnion this_02;
  Type *pTVar8;
  Model *pMVar9;
  ostream *poVar10;
  Rep *pRVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  Result res;
  Model m1;
  Model mlmodel;
  undefined1 local_90 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  Model local_68;
  Model local_38;
  
  CoreML::Specification::Model::Model(&local_68);
  local_68.specificationversion_ = 7;
  if (local_68.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_68.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_68.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_90 + 0x10;
  local_90._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_90);
  if ((pointer)local_90._0_8_ != pcVar1) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar7 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  pAVar7->datatype_ = 0x10040;
  this = &pAVar7->shape_;
  iVar14 = (pAVar7->shape_).current_size_;
  iVar12 = (pAVar7->shape_).total_size_;
  if (iVar14 == iVar12) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar14 + 1);
    iVar14 = (pAVar7->shape_).current_size_;
    iVar12 = (pAVar7->shape_).total_size_;
  }
  pRVar11 = (pAVar7->shape_).rep_;
  iVar3 = iVar14 + 1;
  (pAVar7->shape_).current_size_ = iVar3;
  pRVar11->elements[iVar14] = 10;
  if (iVar3 == iVar12) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar14 + 2);
    iVar3 = (pAVar7->shape_).current_size_;
    iVar12 = (pAVar7->shape_).total_size_;
    pRVar11 = (pAVar7->shape_).rep_;
  }
  iVar14 = iVar3 + 1;
  this->current_size_ = iVar14;
  pRVar11->elements[iVar3] = 0xb;
  if (iVar14 == iVar12) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar3 + 2);
    iVar14 = (pAVar7->shape_).current_size_;
    pRVar11 = (pAVar7->shape_).rep_;
  }
  this->current_size_ = iVar14 + 1;
  pRVar11->elements[iVar14] = 0xc;
  if (local_68.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_68.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_68.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_90._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"probs","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_90);
  if ((pointer)local_90._0_8_ != pcVar1) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar7 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  pAVar7->datatype_ = 0x10040;
  if (local_68._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_68);
    local_68._oneof_case_[0] = 500;
    this_00.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this_00.neuralnetwork_);
    local_68.Type_.pipelineclassifier_ = this_00.pipelineclassifier_;
  }
  this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_68.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"probs");
  if (this_01->_oneof_case_[0] == 500) {
    this_02 = this_01->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_01);
    this_01->_oneof_case_[0] = 500;
    this_02.convolution_ = (ConvolutionLayerParams *)operator_new(0x60);
    CoreML::Specification::CustomLayerParams::CustomLayerParams(this_02.custom_);
    (this_01->layer_).custom_ = (CustomLayerParams *)this_02;
  }
  local_90._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"CustomClassName","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&(this_02.custom_)->classname_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_90);
  if ((pointer)local_90._0_8_ != pcVar1) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::WeightParams>::TypeHandler>
                     ((RepeatedPtrFieldBase *)&(this_02.convolution_)->kernelsize_,(Type *)0x0);
  local_90._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"somebitshere","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar8->float16value_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_90);
  if ((pointer)local_90._0_8_ != pcVar1) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  CoreML::validate<(MLModelType)500>((Result *)local_90,&local_68);
  bVar2 = CoreML::Result::good((Result *)local_90);
  if (bVar2) {
    CoreML::Model::Model(&local_38,&local_68);
    pMVar9 = CoreML::Model::getProto(&local_38);
    bVar2 = pMVar9->specificationversion_ != 2;
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                 ,0x70);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xf7e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,
                 "mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS11_2"
                 ,0x52);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
    }
    uVar13 = (uint)bVar2;
    CoreML::Model::~Model(&local_38);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xf7a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    uVar13 = 1;
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._8_8_ != &local_78) {
    operator_delete((void *)local_90._8_8_,local_78._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_68);
  return uVar13;
}

Assistant:

int testValidCustom() {

    Specification::Model m1;
    m1.set_specificationversion(MLMODEL_SPECIFICATION_VERSION);

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_DOUBLE);
    shape->add_shape(10);
    shape->add_shape(11);
    shape->add_shape(12);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("probs");
    auto *outvec = out->mutable_type()->mutable_multiarraytype();
    outvec->set_datatype(Specification::ArrayFeatureType_ArrayDataType_DOUBLE);

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *layer = nn->add_layers();
    layer->add_input("input");
    layer->add_output("probs");
    auto *params = layer->mutable_custom();

    params->set_classname("CustomClassName");

    auto *weights = params->add_weights();
    weights->set_float16value("somebitshere");

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    // We'll also test that the spec version is correct here
    Model mlmodel = Model(m1);
    ML_ASSERT(mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS11_2);

    return 0;
}